

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

int __thiscall OB::Parg::pipe_stdin(Parg *this)

{
  int iVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  undefined1 local_38 [12];
  undefined1 local_28 [12];
  Parg *local_18;
  Parg *this_local;
  
  local_18 = this;
  iVar1 = isatty(0);
  if (iVar1 == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_28,
               (istream_type *)&std::cin);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_38);
    __first._12_4_ = 0;
    __first._M_sbuf = (streambuf_type *)local_28._0_8_;
    __first._M_c = local_28._8_4_;
    __last._12_4_ = 0;
    __last._M_sbuf = (streambuf_type *)local_38._0_8_;
    __last._M_c = local_38._8_4_;
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)&this->stdin_,__first,__last);
    this_local._4_4_ = 0;
  }
  else {
    std::__cxx11::string::operator=((string *)&this->stdin_,"");
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int pipe_stdin()
  {
    if (! isatty(STDIN_FILENO))
    {
      stdin_.assign((std::istreambuf_iterator<char>(std::cin)),
        (std::istreambuf_iterator<char>()));
      return 0;
    }
    stdin_ = "";
    return -1;
  }